

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_resampler_config *
ma_resampler_config_init
          (ma_format format,ma_uint32 channels,ma_uint32 sampleRateIn,ma_uint32 sampleRateOut,
          ma_resample_algorithm algorithm)

{
  ma_resampler_config *in_RDI;
  
  if (in_RDI != (ma_resampler_config *)0x0) {
    in_RDI->pBackendUserData = (void *)0x0;
    *(undefined8 *)&in_RDI->linear = 0;
    *(undefined8 *)&in_RDI->algorithm = 0;
    in_RDI->pBackendVTable = (ma_resampling_backend_vtable *)0x0;
  }
  in_RDI->format = format;
  in_RDI->channels = channels;
  in_RDI->sampleRateIn = sampleRateIn;
  in_RDI->sampleRateOut = sampleRateOut;
  in_RDI->algorithm = algorithm;
  (in_RDI->linear).lpfOrder = 4;
  return in_RDI;
}

Assistant:

MA_API ma_resampler_config ma_resampler_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRateIn, ma_uint32 sampleRateOut, ma_resample_algorithm algorithm)
{
    ma_resampler_config config;

    MA_ZERO_OBJECT(&config);
    config.format = format;
    config.channels = channels;
    config.sampleRateIn = sampleRateIn;
    config.sampleRateOut = sampleRateOut;
    config.algorithm = algorithm;

    /* Linear. */
    config.linear.lpfOrder = ma_min(MA_DEFAULT_RESAMPLER_LPF_ORDER, MA_MAX_FILTER_ORDER);

    return config;
}